

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O0

void __thiscall sender::main(sender *this,string *url)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  ostream *poVar4;
  void *pvVar5;
  element_type *peVar6;
  element_type *peVar7;
  unspecified_bool_type uVar8;
  string *in_RSI;
  intrusive_ptr<cppcms::application> app;
  shared_ptr<cppcms::http::context> ctx;
  shared_ptr<cppcms::application_specific_pool> tgt;
  bool to_app;
  src_prop *p;
  src_prop *p_1;
  shared_ptr<cppcms::application_specific_pool> *in_stack_fffffffffffffd78;
  allocator *in_stack_fffffffffffffd80;
  context *in_stack_fffffffffffffd88;
  intrusive_ptr<cppcms::application> *in_stack_fffffffffffffd90;
  src_prop *in_stack_fffffffffffffdb8;
  context *in_stack_fffffffffffffdc0;
  allocator local_189;
  string local_188 [32];
  undefined1 local_168 [8];
  io_service local_160 [8];
  io_service local_158 [8];
  intrusive_ptr<cppcms::application> local_150;
  allocator local_141;
  string local_140 [32];
  undefined1 local_120 [20];
  uint local_10c;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  __shared_ptr local_90 [39];
  allocator local_69;
  string local_68 [32];
  string local_48 [39];
  byte local_21;
  undefined2 *local_20;
  src_prop *local_18;
  
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  if (bVar1) {
    cppcms::application::context();
    local_18 = cppcms::http::context::get_specific<sender::src_prop>(in_stack_fffffffffffffd88);
    if (local_18 == (src_prop *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"FAIL: p in line: ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,0xe2);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      g_fail = 1;
    }
    else {
      cppcms::application::response();
      poVar4 = (ostream *)cppcms::http::response::out();
      poVar4 = std::operator<<(poVar4,"async=");
      bVar2 = cppcms::application::is_asynchronous();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(bVar2 & 1));
      poVar4 = std::operator<<(poVar4,"\nsrc_async=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_18->src_async & 1));
      poVar4 = std::operator<<(poVar4,"\nsrc_created=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_18->src_created & 1));
      poVar4 = std::operator<<(poVar4,"\nsrc_to_app=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_18->src_to_app & 1));
      poVar4 = std::operator<<(poVar4,"\npath=");
      poVar4 = std::operator<<(poVar4,in_RSI);
      std::operator<<(poVar4,"\n");
    }
  }
  else {
    local_20 = (undefined2 *)operator_new(3);
    *(undefined1 *)(local_20 + 1) = 0;
    *local_20 = 0;
    cppcms::application::context();
    cppcms::http::context::reset_specific<sender::src_prop>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    cppcms::application::request();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"to_app",&local_69);
    cppcms::http::request::get(local_48);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    *(bool *)(local_20 + 1) = bVar1;
    local_21 = bVar1;
    uVar3 = cppcms::application::is_asynchronous();
    *(undefined1 *)local_20 = uVar3;
    *(undefined1 *)((long)local_20 + 1) = 0;
    std::shared_ptr<cppcms::application_specific_pool>::shared_ptr
              ((shared_ptr<cppcms::application_specific_pool> *)0x11ff20);
    cppcms::application::request();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"to",&local_d1);
    cppcms::http::request::get(local_b0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    if (bVar1) {
      std::weak_ptr<cppcms::application_specific_pool>::lock
                ((weak_ptr<cppcms::application_specific_pool> *)in_stack_fffffffffffffd88);
      std::shared_ptr<cppcms::application_specific_pool>::operator=
                ((shared_ptr<cppcms::application_specific_pool> *)in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd78);
      std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
                ((shared_ptr<cppcms::application_specific_pool> *)0x120016);
    }
    else {
      std::weak_ptr<cppcms::application_specific_pool>::lock
                ((weak_ptr<cppcms::application_specific_pool> *)in_stack_fffffffffffffd88);
      std::shared_ptr<cppcms::application_specific_pool>::operator=
                ((shared_ptr<cppcms::application_specific_pool> *)in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd78);
      std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
                ((shared_ptr<cppcms::application_specific_pool> *)0x120105);
    }
    cppcms::application::release_context();
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_90);
    if (bVar1) {
      if ((local_21 & 1) == 0) {
        peVar6 = std::
                 __shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1201d3);
        std::shared_ptr<cppcms::application_specific_pool>::shared_ptr
                  ((shared_ptr<cppcms::application_specific_pool> *)in_stack_fffffffffffffd80,
                   in_stack_fffffffffffffd78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_140,"/pool",&local_141);
        cppcms::http::context::submit_to_pool(peVar6,local_120,local_140);
        std::__cxx11::string::~string(local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
        std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
                  ((shared_ptr<cppcms::application_specific_pool> *)0x120269);
        local_10c = 1;
      }
      else {
        booster::intrusive_ptr<cppcms::application>::intrusive_ptr(&local_150);
        std::
        __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1202eb);
        cppcms::application::service();
        cppcms::service::get_io_service();
        cppcms::application_specific_pool::asynchronous_application_by_io_service(local_158);
        booster::intrusive_ptr<cppcms::application>::operator=
                  (in_stack_fffffffffffffd90,
                   (intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffd88);
        booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                  ((intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffd80);
        bVar1 = booster::intrusive_ptr<cppcms::application>::operator!(&local_150);
        if (bVar1) {
          peVar7 = std::
                   __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x120381);
          cppcms::application::service();
          cppcms::service::get_io_service();
          cppcms::application::service();
          cppcms::application_specific_pool::asynchronous_application_by_io_service
                    (local_160,(service *)peVar7);
          booster::intrusive_ptr<cppcms::application>::operator=
                    (in_stack_fffffffffffffd90,
                     (intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffd88);
          booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                    ((intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffd80);
          *(undefined1 *)((long)local_20 + 1) = 1;
        }
        uVar8 = booster::intrusive_ptr::operator_cast_to__((intrusive_ptr *)&local_150);
        if (uVar8 == 0xffffffffffffffff) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"FAIL: app in line: ");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,0x107);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          g_fail = 1;
        }
        else {
          peVar6 = std::
                   __shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1204b3);
          booster::intrusive_ptr<cppcms::application>::intrusive_ptr
                    ((intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffd80,
                     (intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffd78);
          in_stack_fffffffffffffd80 = &local_189;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_188,"/app",in_stack_fffffffffffffd80);
          cppcms::http::context::submit_to_asynchronous_application(peVar6,local_168,local_188);
          std::__cxx11::string::~string(local_188);
          std::allocator<char>::~allocator((allocator<char> *)&local_189);
          booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                    ((intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffd80);
        }
        local_10c = (uint)(uVar8 == 0xffffffffffffffff);
        booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                  ((intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffd80);
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"FAIL: tgt in line: ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,0xfa);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      g_fail = 1;
      local_10c = 1;
    }
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x120564);
    std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
              ((shared_ptr<cppcms::application_specific_pool> *)0x120571);
  }
  return;
}

Assistant:

void main(std::string url)
	{
		if(url!="/sender") {
			src_prop *p = context().get_specific<src_prop>();
			TESTNT(p);
			response().out() << "async=" << is_asynchronous() << "\n"
			"src_async="  << p->src_async   <<"\n"
			"src_created="<< p->src_created <<"\n"
			"src_to_app=" << p->src_to_app  <<"\n"
			"path="       << url<<"\n"
			;
			return;
		}

		src_prop *p=new src_prop();
		context().reset_specific<src_prop>(p);
		
		bool to_app = request().get("to_app")=="1";
		p->src_to_app = to_app;
		p->src_async = is_asynchronous();
		p->src_created = false;
		booster::shared_ptr<cppcms::application_specific_pool> tgt;
		if(request().get("to")=="sync") 
			tgt = pools_->sync.lock();
		else 
			tgt = pools_->async.lock();

		booster::shared_ptr<cppcms::http::context> ctx = release_context();
		TESTNT(tgt);
		
		if(!to_app) {
			ctx->submit_to_pool(tgt,"/pool");
			return; 
		}
		
		booster::intrusive_ptr<cppcms::application> app;
		app =tgt->asynchronous_application_by_io_service(service().get_io_service());
		if(!app) {
			app = tgt->asynchronous_application_by_io_service(service().get_io_service(),service());
			p->src_created=true;
		}
		TESTNT(app);
		ctx->submit_to_asynchronous_application(app,"/app");
	}